

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O2

void __thiscall cppforth::Forth::bracketElse(Forth *this)

{
  ForthStack<unsigned_int> *this_00;
  int iVar1;
  uint uVar2;
  uint src;
  int iVar3;
  string currentWord;
  
  this_00 = &this->dStack;
  iVar3 = 1;
  do {
    while (iVar1 = getSourceBufferRemain(this), iVar1 < 1) {
LAB_0011160b:
      refillNextLine(this);
    }
    bl(this);
    word(this);
    count(this);
    uVar2 = ForthStack<unsigned_int>::getTop(this_00);
    ForthStack<unsigned_int>::pop(this_00);
    src = ForthStack<unsigned_int>::getTop(this_00);
    ForthStack<unsigned_int>::pop(this_00);
    if (uVar2 == 0) goto LAB_0011160b;
    currentWord._M_dataplus._M_p = (pointer)&currentWord.field_2;
    currentWord._M_string_length = 0;
    currentWord.field_2._M_local_buf[0] = '\0';
    moveFromDataSpace(this,&currentWord,src,(ulong)uVar2);
    iVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                      (&currentWord,"[IF]");
    if (iVar1 == 0) {
      iVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              compare(&currentWord,"[ELSE]");
      if (iVar1 == 0) {
        iVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                compare(&currentWord,"[THEN]");
        iVar3 = iVar3 - (uint)(iVar1 != 0);
        if (iVar3 == 0) {
          std::__cxx11::string::~string((string *)&currentWord);
          return;
        }
      }
      else if (iVar3 == 1) {
        iVar3 = 0;
      }
    }
    else {
      iVar3 = iVar3 + 1;
    }
    std::__cxx11::string::~string((string *)&currentWord);
  } while( true );
}

Assistant:

void bracketElse(){
			int level = 1;
			while (true){
				while (getSourceBufferRemain() > 0 ) {
					bl();
					word();
					count();
					auto length = SIZE_T(dStack.getTop()); pop();
					auto caddr = CADDR(dStack.getTop()); pop();
					if (length > 0) {
						std::string currentWord{};
						moveFromDataSpace(currentWord, caddr, length);
						if (currentWord.compare("[IF]")) { level++; }
						else {
							if (currentWord.compare("[ELSE]")) { level--; if (level) level++; }
							else {
								if (currentWord.compare("[THEN]")) { level--; }
								if (level == 0) return;
							}
						}
					}
					else {
						break;
					}
				}
				refillNextLine();
			}
		}